

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O2

char * comma_whacker(char *s)

{
  if ((s == (char *)0x0) && (s = comma_whacker::p, comma_whacker::p == (char *)0x0)) {
    s = (char *)0x0;
  }
  else {
    comma_whacker::p = strchr(s,0x2c);
    comma_whacker::nxt = comma_whacker::p;
    if (comma_whacker::p != (char *)0x0) {
      *comma_whacker::p = '\0';
    }
  }
  return s;
}

Assistant:

char *comma_whacker(char *s)
{
    static char *p;
    static char *nxt;
    char *ret;

    if (s != NULL)
	p = s;

    ret = p;
    
    if (ret != NULL) {
	nxt = strchr(p, ',');

	if (nxt) {
	    *nxt = '\0';
	}

	p = nxt;
    }

    return ret;
}